

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_sort_tree.hpp
# Opt level: O1

float __thiscall
duckdb::Interpolator<false>::Extract<float,float>
          (Interpolator<false> *this,float *dest,Vector *result)

{
  float input;
  float fVar1;
  bool bVar2;
  InvalidInputException *pIVar3;
  duckdb *pdVar4;
  float result_1;
  float local_40;
  float local_3c;
  string local_38;
  
  input = *dest;
  if (this->CRN == this->FRN) {
    pdVar4 = (duckdb *)0x0;
    bVar2 = TryCast::Operation<float,float>(input,&local_40,false);
    if (!bVar2) {
      pIVar3 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      CastExceptionText<float,float>(&local_38,pdVar4,input);
      InvalidInputException::InvalidInputException(pIVar3,&local_38);
      __cxa_throw(pIVar3,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
  }
  else {
    pdVar4 = (duckdb *)0x0;
    bVar2 = TryCast::Operation<float,float>(input,&local_40,false);
    fVar1 = local_40;
    if (!bVar2) {
      pIVar3 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      CastExceptionText<float,float>(&local_38,pdVar4,input);
      InvalidInputException::InvalidInputException(pIVar3,&local_38);
      __cxa_throw(pIVar3,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
    local_3c = dest[1];
    pdVar4 = (duckdb *)0x0;
    bVar2 = TryCast::Operation<float,float>(local_3c,&local_40,false);
    if (!bVar2) {
      pIVar3 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      CastExceptionText<float,float>(&local_38,pdVar4,local_3c);
      InvalidInputException::InvalidInputException(pIVar3,&local_38);
      __cxa_throw(pIVar3,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
    local_40 = (float)((double)(local_40 - fVar1) *
                       (this->RN -
                       (((double)CONCAT44(0x45300000,(int)(this->FRN >> 0x20)) -
                        1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)this->FRN) - 4503599627370496.0))) +
                      (double)fVar1);
  }
  return local_40;
}

Assistant:

inline TARGET_TYPE Extract(const INPUT_TYPE *dest, Vector &result) const {
		if (CRN == FRN) {
			return CastInterpolation::Cast<INPUT_TYPE, TARGET_TYPE>(dest[0], result);
		} else {
			auto lo = CastInterpolation::Cast<INPUT_TYPE, TARGET_TYPE>(dest[0], result);
			auto hi = CastInterpolation::Cast<INPUT_TYPE, TARGET_TYPE>(dest[1], result);
			return CastInterpolation::Interpolate<TARGET_TYPE>(lo, RN - FRN, hi);
		}
	}